

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytracer.h
# Opt level: O1

OutputImage<cert::Color,_120UL,_120UL> * cert::raytrace<120ul,120ul,120ul,120ul,0ul,0ul,3ul>(void)

{
  long lVar1;
  Color CVar2;
  int j;
  long lVar3;
  int i;
  long lVar4;
  OutputImage<cert::Color,_120UL,_120UL> *in_RDI;
  float fVar5;
  float fVar6;
  Vec3 VVar7;
  Vec3 color;
  float u;
  Ray r;
  Camera cam;
  World world;
  OutputImage<cert::Color,_120UL,_120UL> framebuffer;
  Vec3 local_a9c8;
  float local_a9bc;
  float local_a9b8;
  float local_a9b4;
  float local_a9b0;
  float local_a9ac;
  OutputImage<cert::Color,_120UL,_120UL> *local_a9a8;
  Ray local_a9a0;
  Camera local_a988;
  World local_a958;
  undefined2 local_a8f0;
  uint8_t auStack_a8ee [43198];
  
  World::World(&local_a958);
  setup_scene(&local_a958);
  VVar7.z = 3.0;
  VVar7.x = 0.0;
  VVar7.y = 1.0;
  local_a9a8 = in_RDI;
  Camera::Camera(&local_a988,VVar7,(Vec3)ZEXT412(0),(Vec3)ZEXT812(0x3f80000000000000),90.0,1.0);
  lVar4 = 0;
  memset(&local_a8f0,0,0xa8c0);
  do {
    local_a9bc = (float)(int)lVar4;
    lVar3 = 0;
    do {
      local_a9c8.x = 0.0;
      local_a9c8.y = 0.0;
      local_a9c8.z = 0.0;
      local_a9b4 = (float)(int)lVar3;
      fVar5 = 0.0;
      do {
        local_a9b0 = (fVar5 + local_a9bc) / 120.0;
        fVar6 = 0.0;
        local_a9b8 = fVar5;
        do {
          local_a9ac = fVar6;
          Camera::get_ray(&local_a9a0,&local_a988,local_a9b0,(fVar6 + local_a9b4) / 120.0);
          VVar7 = trace(&local_a9a0,&local_a958,0);
          local_a9c8.x = local_a9c8.x + VVar7.x;
          local_a9c8.y = VVar7.y + local_a9c8.y;
          local_a9c8.z = VVar7.z + local_a9c8.z;
          fVar6 = local_a9ac + 0.33333334;
        } while (fVar6 < 1.0);
        fVar5 = local_a9b8 + 0.33333334;
      } while (fVar5 < 1.0);
      local_a9c8.y = local_a9c8.y * 0.11111111;
      local_a9c8.x = local_a9c8.x * 0.11111111;
      local_a9c8.z = local_a9c8.z * 0.11111111;
      CVar2 = vec_to_color(&local_a9c8);
      lVar1 = (lVar3 * 0x78 + lVar4) * 3;
      auStack_a8ee[lVar1] = CVar2.b;
      *(short *)((long)&local_a8f0 + lVar1) = CVar2._0_2_;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x78);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x78);
  memcpy(local_a9a8,&local_a8f0,0xa8c0);
  World::~World(&local_a958);
  return local_a9a8;
}

Assistant:

constexpr auto raytrace ()
{
	World world{};
	// setup_simple_scene (world);
	setup_scene (world);
	Vec3 lookfrom{ 0, 1, 3 };
	Vec3 lookat{ 0, 0, 0 };
	Camera cam{ lookfrom, lookat, VEC3_UP, 90, static_cast<float> (width) / static_cast<float> (height) };

	OutputImage<Color, x_size, y_size> framebuffer{};
	for (int i = 0; i < x_size; i++)
	{
		for (int j = 0; j < y_size; j++)
		{
			Vec3 color (0, 0, 0);
			for (float sX = 0; sX < 1; sX += 1.0 / sample_count)
			{
				for (float sY = 0; sY < 1; sY += 1.0 / sample_count)
				{
					float u = float (i + x_offset + sX) / float (width);
					float v = float (j + y_offset + sY) / float (height);

					Ray r = cam.get_ray (u, v);
					color += trace (r, world, 0);
				}
			}
			color /= static_cast<float> (sample_count * sample_count);

			framebuffer.set (i, j, vec_to_color (color));
		}
	}
	return framebuffer;
}